

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O0

QString * __thiscall QWizardPage::buttonText(QWizardPage *this,WizardButton which)

{
  long lVar1;
  bool bVar2;
  QWizardPagePrivate *key;
  QWizard *pQVar3;
  WizardButton in_EDX;
  QWizard *in_RSI;
  QWizardPage *in_RDI;
  long in_FS_OFFSET;
  QWizardPagePrivate *d;
  QWizardPage *key_00;
  undefined4 in_stack_ffffffffffffffc0;
  QWizard *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  key_00 = in_RDI;
  this_00 = in_RSI;
  key = d_func((QWizardPage *)0x7bd400);
  bVar2 = QMap<int,_QString>::contains((QMap<int,_QString> *)in_RSI,(int *)key_00);
  if (bVar2) {
    QString::QString((QString *)0x7bd44a);
    QMap<int,_QString>::value
              ((QMap<int,_QString> *)CONCAT44(in_EDX,in_stack_ffffffffffffffc0),(int *)key,
               (QString *)in_RSI);
    QString::~QString((QString *)0x7bd46c);
  }
  else {
    pQVar3 = wizard(in_RDI);
    if (pQVar3 == (QWizard *)0x0) {
      QString::QString((QString *)0x7bd4a5);
    }
    else {
      wizard(in_RDI);
      QWizard::buttonText(this_00,in_EDX);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QString *)key_00;
  }
  __stack_chk_fail();
}

Assistant:

QString QWizardPage::buttonText(QWizard::WizardButton which) const
{
    Q_D(const QWizardPage);

    if (d->buttonCustomTexts.contains(which))
        return d->buttonCustomTexts.value(which);

    if (wizard())
        return wizard()->buttonText(which);

    return QString();
}